

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O2

SIBEdge * GetEdge(SIBMesh *mesh,uint32_t posA,uint32_t posB)

{
  pointer pSVar1;
  pointer pSVar2;
  iterator iVar3;
  mapped_type_conflict3 *pmVar4;
  SIBEdge *pSVar5;
  key_type local_3c;
  SIBEdge edge;
  
  local_3c.first = posB;
  if (posA < posB) {
    local_3c.first = posA;
  }
  if (posB < posA) {
    posB = posA;
  }
  local_3c.second = posB;
  iVar3 = std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
          ::find(&(mesh->edgeMap)._M_t,&local_3c);
  if ((_Rb_tree_header *)iVar3._M_node == &(mesh->edgeMap)._M_t._M_impl.super__Rb_tree_header) {
    edge.creased = false;
    edge.faceA = 0xffffffff;
    edge.faceB = 0xffffffff;
    pSVar1 = (mesh->edges).super__Vector_base<SIBEdge,_std::allocator<SIBEdge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar2 = (mesh->edges).super__Vector_base<SIBEdge,_std::allocator<SIBEdge>_>._M_impl.
             super__Vector_impl_data._M_start;
    pmVar4 = std::
             map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
             ::operator[](&mesh->edgeMap,&local_3c);
    *pmVar4 = (mapped_type_conflict3)(((long)pSVar1 - (long)pSVar2) / 0xc);
    std::vector<SIBEdge,_std::allocator<SIBEdge>_>::push_back(&mesh->edges,&edge);
    pSVar5 = (mesh->edges).super__Vector_base<SIBEdge,_std::allocator<SIBEdge>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
  }
  else {
    pSVar5 = (mesh->edges).super__Vector_base<SIBEdge,_std::allocator<SIBEdge>_>._M_impl.
             super__Vector_impl_data._M_start + *(uint *)&iVar3._M_node[1]._M_parent;
  }
  return pSVar5;
}

Assistant:

static SIBEdge& GetEdge(SIBMesh* mesh, uint32_t posA, uint32_t posB) {
    SIBPair pair = (posA < posB) ? SIBPair(posA, posB) : SIBPair(posB, posA);
    std::map<SIBPair, uint32_t>::iterator it = mesh->edgeMap.find(pair);
    if (it != mesh->edgeMap.end())
        return mesh->edges[it->second];

    SIBEdge edge;
    edge.creased = false;
    edge.faceA = edge.faceB = 0xffffffff;
    mesh->edgeMap[pair] = static_cast<uint32_t>(mesh->edges.size());
    mesh->edges.push_back(edge);
    return mesh->edges.back();
}